

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O0

void __thiscall DependanceEstimator::~DependanceEstimator(DependanceEstimator *this)

{
  int local_14;
  int i;
  DependanceEstimator *this_local;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DependanceEstimator_0018e860;
  if ((this->aSamples != (double *)0x0) && (this->aSamples != (double *)0x0)) {
    operator_delete__(this->aSamples);
  }
  if ((this->aOne != (double *)0x0) && (this->aOne != (double *)0x0)) {
    operator_delete__(this->aOne);
  }
  if ((this->aTwo != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aThree != (double *)0x0)) {
    operator_delete__(this->aThree);
  }
  if (this->aDist != (double **)0x0) {
    for (local_14 = 0; local_14 < this->dependanceBins; local_14 = local_14 + 1) {
      if (this->aDist[local_14] != (double *)0x0) {
        operator_delete__(this->aDist[local_14]);
      }
    }
    if (this->aDist != (double **)0x0) {
      operator_delete__(this->aDist);
    }
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

DependanceEstimator::~DependanceEstimator()
{
	if (aSamples)
		delete[] aSamples;
	if (aOne)
		delete[] aOne;
	if (aTwo)
		delete[] aTwo;
	if (aThree)
		delete[] aThree;
	if (aDist) {
		for (int i=0; i<dependanceBins; ++i)
			delete[] aDist[i];
		delete[] aDist;
	}
}